

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c++
# Opt level: O0

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<const_unsigned_char> s)

{
  uint uVar1;
  size_t sVar2;
  uint local_3c;
  uint k;
  uint len;
  byte *data;
  uint h;
  uint r;
  uint m;
  HashCoder *this_local;
  ArrayPtr<const_unsigned_char> s_local;
  
  s_local.ptr = (uchar *)s.size_;
  this_local = (HashCoder *)s.ptr;
  sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  data._4_4_ = (uint)sVar2;
  _k = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  for (local_3c = (uint)sVar2; 3 < local_3c; local_3c = local_3c - 4) {
    data._4_4_ = ((uint)(*(int *)_k * 0x5bd1e995) >> 0x18 ^ *(int *)_k * 0x5bd1e995) * 0x5bd1e995 ^
                 data._4_4_ * 0x5bd1e995;
    _k = _k + 4;
  }
  if (local_3c != 1) {
    if (local_3c != 2) {
      if (local_3c != 3) goto LAB_002db61a;
      data._4_4_ = (uint)_k[2] << 0x10 ^ data._4_4_;
    }
    data._4_4_ = (uint)_k[1] << 8 ^ data._4_4_;
  }
  data._4_4_ = (*_k ^ data._4_4_) * 0x5bd1e995;
LAB_002db61a:
  uVar1 = (data._4_4_ >> 0xd ^ data._4_4_) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

uint HashCoder::operator*(ArrayPtr<const byte> s) const {
  // murmur2 adapted from libc++ source code.
  //
  // TODO(perf): Use CityHash or FarmHash on 64-bit machines? They seem optimized for x86-64; what
  //   about ARM? Ask Vlad for advice.

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = s.size();
  const byte* data = s.begin();
  uint len = s.size();
  for (; len >= 4; data += 4, len -= 4) {
    uint k;
    memcpy(&k, data, sizeof(k));
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }
  switch (len) {
  case 3:
    h ^= data[2] << 16;
    KJ_FALLTHROUGH;
  case 2:
    h ^= data[1] << 8;
    KJ_FALLTHROUGH;
  case 1:
    h ^= data[0];
    h *= m;
  }
  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}